

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

U32 duckdb_zstd::ZSTD_getLowestMatchIndex(ZSTD_matchState_t *ms,U32 curr,uint windowLog)

{
  uint uVar1;
  U32 local_2c;
  U32 local_28;
  U32 matchLowest;
  U32 isDictionary;
  U32 withinWindow;
  U32 lowestValid;
  U32 maxDistance;
  uint windowLog_local;
  U32 curr_local;
  ZSTD_matchState_t *ms_local;
  
  uVar1 = 1 << ((byte)windowLog & 0x1f);
  local_2c = (ms->window).lowLimit;
  local_28 = local_2c;
  if (uVar1 < curr - local_2c) {
    local_28 = curr - uVar1;
  }
  if (ms->loadedDictEnd == 0) {
    local_2c = local_28;
  }
  return local_2c;
}

Assistant:

MEM_STATIC U32 ZSTD_getLowestMatchIndex(const ZSTD_matchState_t* ms, U32 curr, unsigned windowLog)
{
    U32 const maxDistance = 1U << windowLog;
    U32 const lowestValid = ms->window.lowLimit;
    U32 const withinWindow = (curr - lowestValid > maxDistance) ? curr - maxDistance : lowestValid;
    U32 const isDictionary = (ms->loadedDictEnd != 0);
    /* When using a dictionary the entire dictionary is valid if a single byte of the dictionary
     * is within the window. We invalidate the dictionary (and set loadedDictEnd to 0) when it isn't
     * valid for the entire block. So this check is sufficient to find the lowest valid match index.
     */
    U32 const matchLowest = isDictionary ? lowestValid : withinWindow;
    return matchLowest;
}